

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpos.h
# Opt level: O0

uint32_t get_dist_slot(uint32_t dist)

{
  uint local_c;
  uint32_t dist_local;
  
  if (dist < 0x2000) {
    local_c = (uint)""[dist];
  }
  else if (dist < 0x2000000) {
    local_c = ""[dist >> 0xc] + 0x18;
  }
  else {
    local_c = ""[dist >> 0x18] + 0x30;
  }
  return local_c;
}

Assistant:

static inline uint32_t
get_dist_slot(uint32_t dist)
{
	// If it is small enough, we can pick the result directly from
	// the precalculated table.
	if (dist < fastpos_limit(0, 0))
		return lzma_fastpos[dist];

	if (dist < fastpos_limit(0, 1))
		return fastpos_result(dist, 0, 1);

	return fastpos_result(dist, 0, 2);
}